

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScriptGenerator.cxx
# Opt level: O1

string * __thiscall
cmScriptGenerator::CreateConfigTest
          (string *__return_storage_ptr__,cmScriptGenerator *this,string *config)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_48;
  undefined8 local_30;
  char *local_28;
  undefined8 local_20;
  
  local_48.first._M_str = (this->RuntimeConfigVariable)._M_dataplus._M_p;
  local_48.first._M_len = (this->RuntimeConfigVariable)._M_string_length;
  local_48.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_30 = 0xc;
  local_28 = " MATCHES \"^(";
  local_20 = 0;
  views._M_len = 2;
  views._M_array = &local_48;
  cmCatViews(__return_storage_ptr__,views);
  if (config->_M_string_length != 0) {
    cmScriptGeneratorEncodeConfig(config,__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string cmScriptGenerator::CreateConfigTest(const std::string& config)
{
  std::string result = cmStrCat(this->RuntimeConfigVariable, " MATCHES \"^(");
  if (!config.empty()) {
    cmScriptGeneratorEncodeConfig(config, result);
  }
  result += ")$\"";
  return result;
}